

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IArrayBox.cpp
# Opt level: O1

void __thiscall amrex::IArrayBox::readFrom(IArrayBox *this,istream *is)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  IFABio *this_00;
  int tmp_ncomp;
  Box tmp_box;
  IntDescriptor data_descriptor;
  string type;
  int local_8c;
  string local_88;
  IntDescriptor local_68;
  long local_58 [2];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  std::operator>>(is,(string *)&local_48);
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar2 != 0) {
    local_68.numbytes = (Long)local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"IArrayBox::readFrom: IFAB is expected, but instead we have ","")
    ;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48);
    plVar4 = plVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar4) {
      local_88.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar4;
      local_88.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar4 >> 0x20);
      local_88.field_2._8_4_ = (undefined4)plVar3[3];
      local_88.field_2._12_4_ = (undefined4)((ulong)plVar3[3] >> 0x20);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar4;
      local_88.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar4 >> 0x20);
      local_88._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_88._M_string_length._0_4_ = (undefined4)plVar3[1];
    local_88._M_string_length._4_4_ = (undefined4)((ulong)plVar3[1] >> 0x20);
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    Error(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((long *)local_68.numbytes != local_58) {
      operator_delete((void *)local_68.numbytes,local_58[0] + 1);
    }
  }
  IntDescriptor::IntDescriptor(&local_68);
  amrex::operator>>(is,&local_68);
  local_88._M_dataplus._M_p = (pointer)0x100000001;
  local_88._M_string_length._0_4_ = 1;
  local_88._M_string_length._4_4_ = 0;
  local_88.field_2._M_allocated_capacity._0_4_ = 0;
  local_88.field_2._M_allocated_capacity._4_4_ = 0;
  local_88.field_2._8_4_ = 0;
  amrex::operator>>(is,(Box *)&local_88);
  std::istream::operator>>((istream *)is,&local_8c);
  std::istream::ignore((long)is,99999);
  this_00 = (IFABio *)&(this->super_BaseFab<int>).domain;
  bVar1 = Box::operator==((Box *)this_00,(Box *)&local_88);
  if ((!bVar1) || ((this->super_BaseFab<int>).nvar != local_8c)) {
    this_00 = (IFABio *)this;
    resize(this,(Box *)&local_88,local_8c,(Arena *)0x0);
  }
  IFABio::read(this_00,(int)is,this,(size_t)&local_68);
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return;
}

Assistant:

void
IArrayBox::readFrom (std::istream& is)
{
    std::string type;
    is >> type;
    if (type != "IFAB") {
        amrex::Error(std::string("IArrayBox::readFrom: IFAB is expected, but instead we have ")
                     +type);
    }

    IntDescriptor data_descriptor;
    is >> data_descriptor;

    Box tmp_box;
    int tmp_ncomp;
    is >> tmp_box;
    is >> tmp_ncomp;
    is.ignore(99999, '\n');

    if (this->box() != tmp_box || this->nComp() != tmp_ncomp) {
        this->resize(tmp_box, tmp_ncomp);
    }

#ifdef AMREX_USE_GPU
    if (this->arena()->isManaged() || this->arena()->isDevice()) {
        IArrayBox hostfab(this->box(), this->nComp(), The_Pinned_Arena());
        ifabio->read(is, hostfab, data_descriptor);
        Gpu::htod_memcpy_async(this->dataPtr(), hostfab.dataPtr(),
                               hostfab.size()*sizeof(IArrayBox::value_type));
        Gpu::streamSynchronize();
    } else
#endif
    {
        ifabio->read(is, *this, data_descriptor);
    }
}